

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall string_conv_wchar_Test::TestBody(string_conv_wchar_Test *this)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  long lVar5;
  wchar_t wVar6;
  Type TVar7;
  char *pcVar8;
  AssertionResult gtest_ar_6;
  wchar_buffer from_latin_1;
  wchar_buffer from_utf32;
  wchar_buffer from_utf16;
  wchar_buffer from_utf8;
  AssertHelper local_130;
  AssertHelper local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  AssertHelper local_118;
  undefined1 local_110 [8];
  AssertHelperData *local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelperData *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [8];
  AssertHelperData *local_88;
  type local_50;
  
  ST::utf8_to_wchar<wchar_t>(&local_50,utf8_test_data,0x1c,check_validity);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  local_110 = (undefined1  [8])local_50.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_90,"text_size(wide_test_data)","from_utf8.size()",
             (unsigned_long *)&local_d0,(unsigned_long *)local_110);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_88 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_88;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x18d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_88 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  local_d0._M_head_impl = local_d0._M_head_impl & 0xffffffff00000000;
  wVar6 = *local_50.m_chars;
  wVar1 = L' ';
  if (wVar6 == L' ') {
    lVar5 = 4;
    do {
      if (wVar1 == L'\0') {
        iVar2 = 0;
        goto LAB_0013914f;
      }
      wVar1 = *(wchar_t *)((long)L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff" + lVar5);
      wVar6 = *(wchar_t *)((long)local_50.m_chars + lVar5);
      lVar5 = lVar5 + 4;
    } while (wVar1 == wVar6);
  }
  iVar2 = wVar1 - wVar6;
LAB_0013914f:
  local_110._0_4_ = iVar2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_90,"0","T_strcmp(wide_test_data, from_utf8.data())",(int *)&local_d0,
             (int *)local_110);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_88 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_88;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x18e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_88 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  ST::utf16_to_wchar<wchar_t>
            ((type *)local_90,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xe,check_validity);
  local_110 = (undefined1  [8])&DAT_0000000a;
  local_128.data_ = local_88;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d0,"text_size(wide_test_data)","from_utf16.size()",
             (unsigned_long *)local_110,(unsigned_long *)&local_128);
  if (local_d0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_c8 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&local_c8->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x193,pcVar8);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_c8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  }
  local_110 = (undefined1  [8])((ulong)local_110 & 0xffffffff00000000);
  iVar2 = *(int *)CONCAT71(local_90._1_7_,local_90[0]);
  iVar3 = 0x20;
  if (iVar2 == 0x20) {
    lVar5 = 4;
    do {
      if (iVar3 == 0) {
        iVar3 = 0;
        goto LAB_00139313;
      }
      iVar3 = *(int *)((long)L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff" + lVar5);
      iVar2 = *(int *)((long)CONCAT71(local_90._1_7_,local_90[0]) + lVar5);
      lVar5 = lVar5 + 4;
    } while (iVar3 == iVar2);
  }
  iVar3 = iVar3 - iVar2;
LAB_00139313:
  local_128.data_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_d0,"0","T_strcmp(wide_test_data, from_utf16.data())",
             (int *)local_110,(int *)&local_128);
  if (local_d0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_c8 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&local_c8->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x194,pcVar8);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_c8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  local_c8 = (AssertHelperData *)&DAT_0000000a;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  wmemmove((wchar_t *)local_d0._M_head_impl,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",10);
  *(undefined4 *)(local_d0._M_head_impl + (long)local_c8 * 4) = 0;
  local_128.data_ = (AssertHelperData *)&DAT_0000000a;
  local_130.data_ = local_c8;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_110,"text_size(wide_test_data)","from_utf32.size()",
             (unsigned_long *)&local_128,(unsigned_long *)&local_130);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_108 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x199,pcVar8);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_128.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_128.data_ + 8))();
    }
  }
  if (local_108 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  local_128.data_ = local_128.data_ & 0xffffffff00000000;
  wVar6 = *(wchar_t *)local_d0._M_head_impl;
  wVar1 = L' ';
  if (wVar6 == L' ') {
    lVar5 = 4;
    do {
      if (wVar1 == L'\0') {
        iVar2 = 0;
        goto LAB_001394df;
      }
      wVar1 = *(wchar_t *)((long)L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff" + lVar5);
      wVar6 = *(wchar_t *)(local_d0._M_head_impl + lVar5);
      lVar5 = lVar5 + 4;
    } while (wVar1 == wVar6);
  }
  iVar2 = wVar1 - wVar6;
LAB_001394df:
  local_130.data_._0_4_ = iVar2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_110,"0","T_strcmp(wide_test_data, from_utf32.data())",
             (int *)&local_128,(int *)&local_130);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_108 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_128.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_128.data_ + 8))();
    }
  }
  if (local_108 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  ST::latin_1_to_wchar<wchar_t>((type *)local_110,latin1_data,4);
  local_130.data_ = (AssertHelperData *)&DAT_00000004;
  local_118.data_ = local_108;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_128,"text_size(latin1_wide)","from_latin_1.size()",
             (unsigned_long *)&local_130,(unsigned_long *)&local_118);
  if (local_128.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19e,pcVar8);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_130.data_ = local_130.data_ & 0xffffffff00000000;
  TVar7 = *(Type *)local_110;
  TVar4 = 0x20;
  if (TVar7 == 0x20) {
    lVar5 = 4;
    do {
      if (TVar4 == kSuccess) {
        iVar2 = 0;
        goto LAB_00139686;
      }
      TVar4 = *(Type *)((long)L" ~\xa0ÿ" + lVar5);
      TVar7 = *(Type *)((long)(Type *)local_110 + lVar5);
      lVar5 = lVar5 + 4;
    } while (TVar4 == TVar7);
  }
  iVar2 = TVar4 - TVar7;
LAB_00139686:
  local_118.data_._0_4_ = iVar2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_128,"0","T_strcmp(latin1_wide, from_latin_1.data())",
             (int *)&local_130,(int *)&local_118);
  if (local_128.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19f,pcVar8);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  if (((AssertHelperData *)0xb < local_108) && (local_110 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_110);
  }
  if (((AssertHelperData *)0xb < local_c8) &&
     (local_d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    operator_delete__(local_d0._M_head_impl);
  }
  if (((AssertHelperData *)0xb < local_88) &&
     ((void *)CONCAT71(local_90._1_7_,local_90[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_90._1_7_,local_90[0]));
  }
  if (((AssertHelperData *)0xb < local_50.m_size) && (local_50.m_chars != (wchar_t *)0x0)) {
    operator_delete__(local_50.m_chars);
  }
  return;
}

Assistant:

TEST(string, conv_wchar)
{
    // From UTF-8 to Wide
    ST::wchar_buffer from_utf8 = ST::utf8_to_wchar(utf8_test_data, text_size(utf8_test_data),
                                                   ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf8.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf8.data()));

    // From UTF-16 to Wide
    ST::wchar_buffer from_utf16 = ST::utf16_to_wchar(utf16_test_data, text_size(utf16_test_data),
                                                     ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf16.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf16.data()));

    // From UTF-32 to Wide
    ST::wchar_buffer from_utf32 = ST::utf32_to_wchar(test_data, text_size(test_data),
                                                     ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf32.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf32.data()));

    // From Latin-1 to Wide
    ST::wchar_buffer from_latin_1 = ST::latin_1_to_wchar(latin1_data, text_size(latin1_data));
    EXPECT_EQ(text_size(latin1_wide), from_latin_1.size());
    EXPECT_EQ(0, T_strcmp(latin1_wide, from_latin_1.data()));
}